

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dtd_chain(DLword type)

{
  LispPTR *local_28;
  LispPTR *next68k;
  LispPTR next;
  dtd *dtdp;
  DLword type_local;
  
  next68k._4_4_ =
       *(LispPTR *)(DTDspace + (long)(int)((uint)type << 4) + (long)(int)((uint)type << 1) + 4);
  local_28 = NativeAligned4FromLAddr(next68k._4_4_);
  while( true ) {
    if (*local_28 == 0) {
      printf("That\'s All !\n");
      return;
    }
    if (type != (*(ushort *)((ulong)(MDStypetbl + (next68k._4_4_ >> 9)) ^ 2) & 0x7ff)) break;
    print(next68k._4_4_);
    putchar(10);
    next68k._4_4_ = *local_28;
    local_28 = NativeAligned4FromLAddr(next68k._4_4_);
  }
  printf("BAD cell in next dtdfree\n");
  return;
}

Assistant:

void dtd_chain(DLword type) {
  struct dtd *dtdp;
  LispPTR next;
  LispPTR *next68k;

  dtdp = (struct dtd *)GetDTD(type);

  next = dtdp->dtd_free;
  next68k = (LispPTR *)NativeAligned4FromLAddr(next);

  while ((*next68k) != 0) {
    if (type != GetTypeNumber(next)) {
      printf("BAD cell in next dtdfree\n");
      return;
    }
    print(next);
    putchar('\n');

    next = *next68k;
    next68k = (LispPTR *)NativeAligned4FromLAddr(next);
  }
  printf("That's All !\n");

}